

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_db.cpp
# Opt level: O3

void __thiscall
Fossilize::StreamArchive::StreamArchive(StreamArchive *this,string *path_,DatabaseMode mode_)

{
  pointer pcVar1;
  __node_base_ptr *pp_Var2;
  long lVar3;
  
  DatabaseInterface::DatabaseInterface(&this->super_DatabaseInterface,mode_);
  (this->super_DatabaseInterface)._vptr_DatabaseInterface =
       (_func_int **)&PTR__StreamArchive_00175be0;
  this->imported_metadata = (ExportedMetadataHeader *)0x0;
  this->file = (FILE *)0x0;
  (this->path)._M_dataplus._M_p = (pointer)&(this->path).field_2;
  pcVar1 = (path_->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->path,pcVar1,pcVar1 + path_->_M_string_length);
  pp_Var2 = &this->seen_blobs[0]._M_h._M_single_bucket;
  lVar3 = 0x230;
  do {
    ((_Hashtable *)(pp_Var2 + -6))->_M_buckets = pp_Var2;
    pp_Var2[-5] = (__node_base_ptr)0x1;
    ((__node_base *)(pp_Var2 + -4))->_M_nxt = (_Hash_node_base *)0x0;
    pp_Var2[-3] = (__node_base_ptr)0x0;
    ((_Prime_rehash_policy *)(pp_Var2 + -2))->_M_max_load_factor = 1.0;
    pp_Var2[-1] = (__node_base_ptr)0x0;
    *pp_Var2 = (__node_base_ptr)0x0;
    pp_Var2 = pp_Var2 + 7;
    lVar3 = lVar3 + -0x38;
  } while (lVar3 != 0);
  this->mode = mode_;
  (this->read_lock).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->read_lock).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->read_lock).super___mutex_base._M_mutex + 0x10) = 0;
  (this->read_lock).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->read_lock).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  this->zlib_buffer = (uint8_t *)0x0;
  this->zlib_buffer_size = 0;
  this->alive = false;
  return;
}

Assistant:

StreamArchive(const string &path_, DatabaseMode mode_)
		: DatabaseInterface(mode_), path(path_), mode(mode_)
	{
	}